

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-bool.cpp
# Opt level: O2

void bool_linear(vec<BoolView> *x,IntRelType t,IntVar *y)

{
  uint uVar1;
  BoolLinearLE<5> *pBVar2;
  BoolLinearLE<4> *this;
  BoolLinearLE<0> *pBVar3;
  long lVar4;
  uint i;
  ulong uVar5;
  IntView<0> _y;
  IntView<5> _y_00;
  IntView<5> _y_01;
  IntView<4> _y_02;
  IntView<5> _y_03;
  IntView<0> _y_04;
  vec<BoolView> x2;
  BoolView local_40;
  
  x2.sz = 0;
  x2.cap = 0;
  x2.data = (BoolView *)0x0;
  lVar4 = 0xc;
  uVar5 = 0;
  while( true ) {
    uVar1 = x->sz;
    if (uVar1 <= uVar5) break;
    local_40.v = *(int *)((long)x->data + lVar4 + -4);
    local_40.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_40.s = (bool)(*(byte *)((long)&(x->data->super_Var).super_Branching._vptr_Branching +
                                 lVar4) ^ 1);
    vec<BoolView>::push(&x2,&local_40);
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x10;
  }
  switch(t) {
  case IRT_EQ:
    pBVar3 = (BoolLinearLE<0> *)operator_new(0x50);
    _y.a = 1;
    _y.b = 0;
    _y.var = y;
    BoolLinearLE<0>::BoolLinearLE(pBVar3,x,_y);
    pBVar2 = (BoolLinearLE<5> *)operator_new(0x50);
    _y_00._8_8_ = ((ulong)x->sz << 0x20) + 1;
    _y_00.var = y;
    BoolLinearLE<5>::BoolLinearLE(pBVar2,&x2,_y_00);
    break;
  default:
    fprintf(_stderr,"%s:%d: ","linear-bool.cpp",0x6a);
    fprintf(_stderr,"Unknown IntRelType %d\n",(ulong)t);
    abort();
  case IRT_LE:
    pBVar3 = (BoolLinearLE<0> *)operator_new(0x50);
    _y_04.a = 1;
    _y_04.b = 0;
    _y_04.var = y;
    BoolLinearLE<0>::BoolLinearLE(pBVar3,x,_y_04);
    break;
  case IRT_LT:
    this = (BoolLinearLE<4> *)operator_new(0x50);
    _y_02.a = 1;
    _y_02.b = -1;
    _y_02.var = y;
    BoolLinearLE<4>::BoolLinearLE(this,x,_y_02);
    break;
  case IRT_GE:
    pBVar2 = (BoolLinearLE<5> *)operator_new(0x50);
    _y_03._8_8_ = ((ulong)uVar1 << 0x20) + 1;
    _y_03.var = y;
    BoolLinearLE<5>::BoolLinearLE(pBVar2,&x2,_y_03);
    break;
  case IRT_GT:
    pBVar2 = (BoolLinearLE<5> *)operator_new(0x50);
    _y_01._8_8_ = ((ulong)(uVar1 - 1) << 0x20) + 1;
    _y_01.var = y;
    BoolLinearLE<5>::BoolLinearLE(pBVar2,&x2,_y_01);
  }
  vec<BoolView>::~vec(&x2);
  return;
}

Assistant:

void bool_linear(vec<BoolView>& x, IntRelType t, IntVar* y) {
	vec<BoolView> x2;
	for (unsigned int i = 0; i < x.size(); i++) {
		x2.push(~x[i]);
	}
	switch (t) {
		case IRT_EQ:
			// sum x_i = y <=> sum x_i <= y /\ sum (1-x_i) <= (-y+x.size())
			new BoolLinearLE<0>(x, IntView<0>(y));
			new BoolLinearLE<5>(x2, IntView<5>(y, 1, x.size()));
			break;
		case IRT_LE:
			// sum x_i <= y
			new BoolLinearLE<0>(x, IntView<0>(y));
			break;
		case IRT_LT:
			// sum x_i < y <=> sum x_i <= (y-1)
			new BoolLinearLE<4>(x, IntView<4>(y, 1, -1));
			break;
		case IRT_GE:
			// sum x_i >= y <=> sum (1-x_i) <= (-y+x.size())
			new BoolLinearLE<5>(x2, IntView<5>(y, 1, x.size()));
			break;
		case IRT_GT:
			// sum x_i > y <=> sum (1-x_i) <= (-y+x.size()-1)
			new BoolLinearLE<5>(x2, IntView<5>(y, 1, x.size() - 1));
			break;
		default:
			CHUFFED_ERROR("Unknown IntRelType %d\n", t);
	}
}